

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O0

Error __thiscall asmjit::StringBuilder::reserve(StringBuilder *this,size_t to)

{
  ulong uVar1;
  void *__dest;
  ulong in_RSI;
  undefined8 *in_RDI;
  char *newData;
  Error local_2c;
  
  if ((ulong)in_RDI[2] < in_RSI) {
    if (in_RSI < 0xffffffffffffffef) {
      uVar1 = in_RSI + 7 & 0xfffffffffffffff8;
      __dest = malloc(uVar1 + 8);
      if (__dest == (void *)0x0) {
        local_2c = 1;
      }
      else {
        memcpy(__dest,(void *)*in_RDI,in_RDI[1] + 1);
        if (in_RDI[3] != 0) {
          free((void *)*in_RDI);
        }
        *in_RDI = __dest;
        in_RDI[2] = uVar1 + 7;
        in_RDI[3] = 1;
        local_2c = 0;
      }
    }
    else {
      local_2c = 1;
    }
  }
  else {
    local_2c = 0;
  }
  return local_2c;
}

Assistant:

ASMJIT_FAVOR_SIZE Error StringBuilder::reserve(size_t to) noexcept {
  if (_capacity >= to)
    return kErrorOk;

  if (to >= IntTraits<size_t>::maxValue() - sizeof(intptr_t) * 2)
    return DebugUtils::errored(kErrorNoHeapMemory);

  to = Utils::alignTo<size_t>(to, sizeof(intptr_t));
  char* newData = static_cast<char*>(Internal::allocMemory(to + sizeof(intptr_t)));

  if (!newData)
    return DebugUtils::errored(kErrorNoHeapMemory);

  ::memcpy(newData, _data, _length + 1);
  if (_canFree)
    Internal::releaseMemory(_data);

  _data = newData;
  _capacity = to + sizeof(intptr_t) - 1;
  _canFree = true;
  return kErrorOk;
}